

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O3

bool __thiscall QThreadPoolPrivate::waitForDone(QThreadPoolPrivate *this,QDeadlineTimer *timer)

{
  QMutex *this_00;
  __pointer_type copy;
  qsizetype qVar1;
  bool bVar2;
  
  this_00 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar2 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar2) goto LAB_003c7b02;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_003c7b02:
  qVar1 = 0;
  while (((this->queue).d.size != 0 || (this->activeThreads != 0))) {
    bVar2 = QDeadlineTimer::hasExpired(timer);
    if (bVar2) {
      qVar1 = (this->queue).d.size;
      bVar2 = this->activeThreads == 0;
LAB_003c7b56:
      bVar2 = (bool)(qVar1 == 0 & bVar2);
      if (bVar2 == true) {
        reset(this);
      }
      LOCK();
      copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (copy != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
      }
      return bVar2;
    }
    QWaitCondition::wait(&this->noActiveThreads,this_00);
  }
  bVar2 = true;
  goto LAB_003c7b56;
}

Assistant:

bool QThreadPoolPrivate::waitForDone(const QDeadlineTimer &timer)
{
    QMutexLocker locker(&mutex);
    while (!(queue.isEmpty() && activeThreads == 0) && !timer.hasExpired())
        noActiveThreads.wait(&mutex, timer);

    if (!queue.isEmpty() || activeThreads)
        return false;

    reset();
    // New jobs might have started during reset, but return anyway
    // as the active thread and task count did reach 0 once, and
    // race conditions are outside our scope.
    return true;
}